

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t id_00;
  Instruction *pIVar3;
  
  pIVar3 = FindDef(this,id);
  if (pIVar3 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3d6,
                  "bool spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(uint32_t) const");
  }
  if ((pIVar3->inst_).opcode == 0x17) {
    uVar2 = GetDimension(this,id);
    id_00 = GetComponentType(this,id);
    bVar1 = IsFloatScalarType(this,id_00);
    if ((bVar1) && ((uVar2 == 4 || (uVar2 == 2)))) {
      uVar2 = GetComponentType(this,id);
      uVar2 = GetBitWidth(this,uVar2);
      return uVar2 == 0x10;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsFloat16Vector2Or4Type(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t vectorDim = GetDimension(id);
    return IsFloatScalarType(GetComponentType(id)) &&
           (vectorDim == 2 || vectorDim == 4) &&
           (GetBitWidth(GetComponentType(id)) == 16);
  }

  return false;
}